

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

uint upsampled_setup_center_error
               (MACROBLOCKD *xd,AV1_COMMON *cm,MV *bestmv,SUBPEL_SEARCH_VAR_PARAMS *var_params,
               MV_COST_PARAMS *mv_cost_params,uint *sse1,int *distortion)

{
  MV_COST_TYPE MVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  
  iVar4 = upsampled_pref_error(xd,cm,bestmv,var_params,sse1);
  *distortion = iVar4;
  MVar1 = mv_cost_params->mv_cost_type;
  iVar5 = 0;
  if (MVar1 != '\x04') {
    sVar2 = mv_cost_params->ref_mv->row;
    sVar6 = bestmv->row - sVar2;
    sVar3 = mv_cost_params->ref_mv->col;
    sVar8 = bestmv->col - sVar3;
    sVar7 = -sVar6;
    if (0 < sVar6) {
      sVar7 = sVar6;
    }
    sVar9 = -sVar8;
    if (0 < sVar8) {
      sVar9 = sVar8;
    }
    if (MVar1 == '\x03') {
      iVar5 = (int)sVar9 + (int)sVar7 >> 3;
    }
    else if (MVar1 == '\x01') {
      iVar5 = (int)sVar9 + (int)sVar7 >> 2;
    }
    else if (MVar1 == '\0') {
      iVar5 = (int)(((long)mv_cost_params->mvcost[1][sVar8] + (long)mv_cost_params->mvcost[0][sVar6]
                    + (long)*(int *)((long)mv_cost_params->mvjcost +
                                    (ulong)((uint)(bestmv->col != sVar3) * 4 +
                                           (uint)(bestmv->row != sVar2) * 8))) *
                    (long)mv_cost_params->error_per_bit + 0x2000U >> 0xe);
    }
  }
  return iVar5 + iVar4;
}

Assistant:

static unsigned int upsampled_setup_center_error(
    MACROBLOCKD *xd, const AV1_COMMON *const cm, const MV *bestmv,
    const SUBPEL_SEARCH_VAR_PARAMS *var_params,
    const MV_COST_PARAMS *mv_cost_params, unsigned int *sse1, int *distortion) {
  unsigned int besterr = upsampled_pref_error(xd, cm, bestmv, var_params, sse1);
  *distortion = besterr;
  besterr += mv_err_cost_(bestmv, mv_cost_params);
  return besterr;
}